

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

int yaml_emitter_emit(yaml_emitter_t *emitter,yaml_event_t *event)

{
  yaml_event_t **tail;
  int *piVar1;
  int *piVar2;
  int *piVar3;
  yaml_emitter_state_t **top;
  yaml_emitter_state_t **end;
  yaml_event_type_t yVar4;
  byte *pbVar5;
  size_t sVar6;
  yaml_tag_directive_t *pyVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined4 uVar14;
  int iVar15;
  yaml_encoding_t yVar16;
  yaml_event_t *pyVar17;
  byte *pbVar18;
  int *piVar19;
  yaml_emitter_state_t *pyVar20;
  yaml_char_t *pyVar21;
  char *pcVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  long lVar26;
  char cVar27;
  byte bVar28;
  int iVar29;
  long lVar30;
  yaml_event_t *pyVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  uint uVar36;
  yaml_event_t *pyVar37;
  ulong uVar38;
  byte bVar39;
  byte *pbVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  byte bVar44;
  int local_9c;
  
  bVar44 = 0;
  pyVar37 = (emitter->events).tail;
  if (pyVar37 == (emitter->events).end) {
    tail = &(emitter->events).tail;
    iVar15 = yaml_queue_extend(&(emitter->events).start,&(emitter->events).head,tail,
                               &(emitter->events).end);
    if (iVar15 == 0) {
      emitter->error = YAML_MEMORY_ERROR;
      yaml_event_delete(event);
      return 0;
    }
    pyVar37 = *tail;
  }
  (emitter->events).tail = pyVar37 + 1;
  for (lVar26 = 0xd; lVar26 != 0; lVar26 = lVar26 + -1) {
    uVar14 = *(undefined4 *)&event->field_0x4;
    pyVar37->type = event->type;
    *(undefined4 *)&pyVar37->field_0x4 = uVar14;
    event = (yaml_event_t *)((long)event + (ulong)bVar44 * -0x10 + 8);
    pyVar37 = (yaml_event_t *)((long)pyVar37 + (ulong)bVar44 * -0x10 + 8);
  }
  pyVar37 = (emitter->events).head;
  pyVar17 = (emitter->events).tail;
  if (pyVar37 != pyVar17) {
    piVar1 = &(emitter->scalar_data).flow_plain_allowed;
    piVar2 = &(emitter->scalar_data).block_plain_allowed;
    piVar3 = &(emitter->scalar_data).block_allowed;
    top = &(emitter->states).top;
    end = &(emitter->states).end;
    do {
      yVar4 = pyVar37->type;
      if (yVar4 == YAML_DOCUMENT_START_EVENT) {
        lVar26 = 1;
LAB_00105f58:
        lVar30 = ((long)pyVar17 - (long)pyVar37 >> 3) * 0x4ec4ec4ec4ec4ec5;
        if (lVar30 - lVar26 == 0 || lVar30 < lVar26) {
          iVar15 = 0;
          pyVar31 = pyVar37;
          while( true ) {
            yVar4 = pyVar31->type;
            if (yVar4 < (YAML_MAPPING_END_EVENT|YAML_STREAM_START_EVENT)) {
              if ((0x28aU >> (yVar4 & 0x1f) & 1) == 0) {
                if ((0x514U >> (yVar4 & 0x1f) & 1) != 0) {
                  iVar15 = iVar15 + -1;
                }
              }
              else {
                iVar15 = iVar15 + 1;
              }
            }
            if (iVar15 == 0) break;
            pyVar31 = pyVar31 + 1;
            if (pyVar31 == pyVar17) {
              return 1;
            }
          }
        }
      }
      else {
        if (yVar4 == YAML_MAPPING_START_EVENT) {
          lVar26 = 3;
          goto LAB_00105f58;
        }
        if (yVar4 == YAML_SEQUENCE_START_EVENT) {
          lVar26 = 2;
          goto LAB_00105f58;
        }
      }
      (emitter->anchor_data).anchor = (yaml_char_t *)0x0;
      (emitter->anchor_data).anchor_length = 0;
      (emitter->scalar_data).value = (yaml_char_t *)0x0;
      (emitter->scalar_data).length = 0;
      (emitter->tag_data).suffix = (yaml_char_t *)0x0;
      (emitter->tag_data).suffix_length = 0;
      (emitter->tag_data).handle = (yaml_char_t *)0x0;
      (emitter->tag_data).handle_length = 0;
      switch(pyVar37->type) {
      case YAML_ALIAS_EVENT:
        iVar15 = yaml_emitter_analyze_anchor(emitter,(pyVar37->data).scalar.anchor,1);
LAB_00106031:
        if (iVar15 == 0) {
          return 0;
        }
        break;
      case YAML_SCALAR_EVENT:
        pyVar21 = (pyVar37->data).scalar.anchor;
        if ((pyVar21 != (yaml_char_t *)0x0) &&
           (iVar15 = yaml_emitter_analyze_anchor(emitter,pyVar21,0), iVar15 == 0)) {
          return 0;
        }
        pyVar21 = (pyVar37->data).scalar.tag;
        if ((pyVar21 != (yaml_char_t *)0x0) &&
           (((emitter->canonical != 0 ||
             (((pyVar37->data).scalar.plain_implicit == 0 &&
              ((pyVar37->data).scalar.quoted_implicit == 0)))) &&
            (iVar15 = yaml_emitter_analyze_tag(emitter,pyVar21), iVar15 == 0)))) {
          return 0;
        }
        pbVar5 = (pyVar37->data).scalar.value;
        sVar6 = (pyVar37->data).scalar.length;
        (emitter->scalar_data).value = pbVar5;
        (emitter->scalar_data).length = sVar6;
        if (sVar6 == 0) {
          (emitter->scalar_data).multiline = 0;
          (emitter->scalar_data).flow_plain_allowed = 0;
          (emitter->scalar_data).block_plain_allowed = 1;
          (emitter->scalar_data).single_quoted_allowed = 1;
          piVar19 = piVar3;
        }
        else {
          bVar44 = *pbVar5;
          uVar38 = (ulong)bVar44;
          if (bVar44 == 0x2e) {
            bVar9 = false;
            if ((pbVar5[1] == 0x2e) && (pbVar5[2] == 0x2e)) {
LAB_001060fe:
              bVar9 = true;
            }
LAB_0010611a:
            lVar26 = 1;
            bVar42 = true;
          }
          else {
            if (bVar44 == 0x2d) {
              bVar9 = false;
              if ((pbVar5[1] == 0x2d) && (bVar9 = false, pbVar5[2] == 0x2d)) goto LAB_001060fe;
              goto LAB_0010611a;
            }
            if (-1 < (char)bVar44) {
              bVar9 = false;
              goto LAB_0010611a;
            }
            if ((bVar44 & 0xe0) == 0xc0) {
              lVar26 = 2;
            }
            else if ((bVar44 & 0xf0) == 0xe0) {
              lVar26 = 3;
            }
            else {
              lVar26 = (ulong)((bVar44 & 0xf8) == 0xf0) << 2;
            }
            bVar42 = false;
            bVar9 = false;
          }
          bVar43 = true;
          uVar8 = (uint)bVar44;
          if (pbVar5[lVar26] != 0x20) {
            if (bVar42) {
              bVar28 = pbVar5[1];
              if (((0xd < bVar28) || ((0x2600U >> (bVar28 & 0x1f) & 1) == 0)) &&
                 ((lVar26 = 1, bVar28 != 0xc2 || (pbVar5[2] != 0x85)))) {
LAB_0010641f:
                bVar43 = pbVar5[lVar26] == 0;
              }
            }
            else {
              bVar28 = bVar44 & 0xe0;
              if (bVar28 == 0xc0) {
                bVar39 = pbVar5[2];
                if ((0xd < bVar39) || ((0x2600U >> (bVar39 & 0x1f) & 1) == 0)) {
                  if (bVar39 != 0xc2) {
                    if (bVar39 != 0xe2) goto LAB_001063ec;
LAB_001062cc:
                    if (bVar28 == 0xc0) {
                      lVar26 = 2;
                      goto LAB_0010641f;
                    }
                    goto LAB_001063ff;
                  }
                  if (pbVar5[3] != 0x85) goto LAB_001063ec;
                }
              }
              else {
                lVar26 = (ulong)((bVar44 & 0xf8) == 0xf0) << 2;
                if ((bVar44 & 0xf0) == 0xe0) {
                  lVar26 = 3;
                }
                bVar39 = pbVar5[lVar26];
                if ((0xd < bVar39) || ((0x2600U >> (bVar39 & 0x1f) & 1) == 0)) {
                  if (bVar39 == 0xc2) {
                    lVar26 = (ulong)((bVar44 & 0xf8) == 0xf0) * 4 + 1;
                    if ((bVar44 & 0xf0) == 0xe0) {
                      lVar26 = 4;
                    }
                    if (pbVar5[lVar26] == 0x85) goto LAB_0010642b;
                  }
                  else if (bVar39 == 0xe2) goto LAB_001062cc;
LAB_001063ec:
                  lVar26 = 2;
                  if (bVar28 != 0xc0) {
LAB_001063ff:
                    lVar26 = 3;
                    if ((bVar44 & 0xf0) != 0xe0) {
                      lVar26 = (ulong)((uVar8 & 0xfffffff8) == 0xf0) << 2;
                    }
                  }
                  goto LAB_0010641f;
                }
              }
            }
          }
LAB_0010642b:
          pbVar40 = pbVar5 + sVar6;
          bVar42 = true;
          bVar41 = false;
          bVar12 = false;
          bVar35 = false;
          bVar25 = false;
          bVar34 = false;
          bVar24 = false;
          bVar33 = false;
          bVar23 = false;
          bVar13 = false;
          local_9c = 0;
          pbVar18 = pbVar5;
          uVar32 = uVar38;
          bVar10 = bVar9;
LAB_0010648a:
          if (pbVar18 == pbVar5) {
            if (((uVar8 - 0x21 < 0x40) &&
                ((0x94000000a0000a77U >> ((ulong)(uVar8 - 0x21) & 0x3f) & 1) != 0)) ||
               (uVar8 - 0x7b < 3)) {
              bVar10 = true;
              bVar9 = true;
            }
            if (((uVar8 == 0x3f) || (uVar8 == 0x3a)) && (bVar9 = true, bVar43)) {
              bVar10 = true;
            }
            uVar32 = uVar38;
            if (bVar44 == 0x2d && bVar43) {
              bVar9 = true;
              bVar10 = true;
            }
          }
          else {
            cVar27 = (char)uVar32;
            uVar36 = (int)uVar32 - 0x3f;
            if (((uVar36 < 0x3f) && ((0x5000000050000001U >> ((ulong)uVar36 & 0x3f) & 1) != 0)) ||
               ((int)uVar32 == 0x2c)) {
              bVar9 = true;
            }
            bVar11 = true;
            if (!bVar43) {
              bVar11 = bVar10;
            }
            if (cVar27 != ':') {
              bVar11 = bVar10;
            }
            if ((bool)(cVar27 == '#' & bVar42)) {
              bVar11 = true;
              bVar9 = true;
            }
            bVar10 = bVar11;
            if (cVar27 == ':') {
              bVar9 = true;
            }
          }
          lVar26 = 1;
          bVar28 = (byte)uVar32;
          uVar36 = (uint)uVar32;
          if (bVar28 == 10) {
            iVar15 = 1;
LAB_0010656a:
            if (pbVar18 == pbVar5) {
              bVar33 = true;
            }
            if (pbVar18 + lVar26 == pbVar40) {
              bVar34 = true;
            }
            bVar42 = true;
            if (bVar12) {
              bVar35 = true;
            }
LAB_0010659c:
            bVar41 = bVar42;
            lVar26 = 1;
            bVar12 = false;
            local_9c = iVar15;
            if ((0x20 < bVar28) || (bVar42 = true, (0x100002600U >> (uVar32 & 0x3f) & 1) == 0)) {
              if (uVar36 == 0xe2) {
                lVar26 = 3;
                bVar12 = false;
                bVar42 = false;
              }
              else if (uVar36 == 0xc2) {
                bVar42 = pbVar18[1] == 0x85;
                lVar26 = 2;
              }
              else {
                bVar42 = bVar28 == 0;
                if ((((char)bVar28 < '\0') && (lVar26 = 2, (uVar36 & 0xe0) != 0xc0)) &&
                   (lVar26 = 3, (uVar36 & 0xf0) != 0xe0)) {
                  lVar26 = (ulong)((uVar36 & 0xf8) == 0xf0) << 2;
                }
              }
            }
          }
          else {
            if (0x5e < (byte)(bVar28 - 0x20)) {
              if (bVar28 == 0xc2) {
                if (pbVar18[1] < 0xa0) goto LAB_0010672f;
LAB_0010662a:
                if (emitter->unicode != 0) goto LAB_00106737;
              }
              else {
                if ((byte)(bVar28 + 0x3d) < 0x2a) goto LAB_0010662a;
                if (bVar28 != 0xef) {
                  if ((uVar36 != 0xee) && ((uVar36 != 0xed || (0x9f < pbVar18[1]))))
                  goto LAB_0010672f;
                  goto LAB_0010662a;
                }
                if (pbVar18[1] == 0xbf) {
                  if ((pbVar18[2] & 0xfe) != 0xbe) goto LAB_0010662a;
                }
                else if ((pbVar18[1] != 0xbb) || (pbVar18[2] != 0xbf)) goto LAB_0010662a;
              }
LAB_0010672f:
              bVar13 = true;
            }
LAB_00106737:
            if (uVar36 < 0xc2) {
              iVar15 = 1;
              if ((uVar36 != 10) && (uVar36 != 0xd)) {
LAB_00106783:
                iVar15 = local_9c;
              }
              if ((bVar28 == 10) || (uVar36 == 0xd)) goto LAB_0010656a;
              bVar42 = false;
              if (uVar36 == 0x20) {
                if (pbVar18 == pbVar5) {
                  bVar23 = true;
                }
                if (pbVar18 + 1 == pbVar40) {
                  bVar24 = true;
                }
                bVar12 = true;
                if (bVar41) {
                  bVar25 = true;
                }
                bVar41 = false;
                bVar42 = true;
                local_9c = iVar15;
                goto LAB_00106825;
              }
              goto LAB_0010659c;
            }
            if (uVar36 == 0xe2) {
              lVar26 = 3;
            }
            else {
              if (uVar36 != 0xc2) goto LAB_00106783;
              lVar26 = 2;
              iVar15 = 1;
              if (pbVar18[1] == 0x85) goto LAB_0010656a;
            }
            bVar42 = false;
            bVar12 = false;
            bVar41 = false;
          }
LAB_00106825:
          pbVar18 = pbVar18 + lVar26;
          if (pbVar18 != pbVar40) {
            bVar28 = *pbVar18;
            uVar32 = (ulong)bVar28;
            if ((char)bVar28 < '\0') {
              if ((bVar28 & 0xe0) != 0xc0) goto LAB_00106900;
              bVar39 = pbVar18[2];
              bVar43 = true;
              if ((0x20 < (ulong)bVar39) || ((0x100002600U >> ((ulong)bVar39 & 0x3f) & 1) == 0)) {
                if (bVar39 != 0xc2) goto LAB_001069ac;
                if (pbVar18[3] != 0x85) goto LAB_001069e9;
              }
            }
            else {
              bVar39 = pbVar18[1];
              bVar43 = true;
              if ((0x20 < (ulong)bVar39) || ((0x100002600U >> ((ulong)bVar39 & 0x3f) & 1) == 0)) {
                lVar26 = 1;
                if (bVar39 != 0xc2) {
                  if (bVar39 != 0xe2) goto LAB_00106a29;
                  goto LAB_00106884;
                }
                if (pbVar18[2] != 0x85) goto LAB_00106a29;
              }
            }
            goto LAB_0010648a;
          }
          (emitter->scalar_data).multiline = local_9c;
          (emitter->scalar_data).flow_plain_allowed = 1;
          (emitter->scalar_data).block_plain_allowed = 1;
          (emitter->scalar_data).single_quoted_allowed = 1;
          (emitter->scalar_data).block_allowed = 1;
          if ((((bVar23) || (bVar33)) || (bVar24)) || (bVar34)) {
            *piVar1 = 0;
            *piVar2 = 0;
            if (bVar24) {
              *piVar3 = 0;
            }
          }
          if (bVar25) {
            (emitter->scalar_data).flow_plain_allowed = 0;
            (emitter->scalar_data).block_plain_allowed = 0;
            (emitter->scalar_data).single_quoted_allowed = 0;
          }
          if (bVar35 || bVar13) {
            (emitter->scalar_data).flow_plain_allowed = 0;
            (emitter->scalar_data).block_plain_allowed = 0;
            (emitter->scalar_data).single_quoted_allowed = 0;
            (emitter->scalar_data).block_allowed = 0;
          }
          if (local_9c != 0) {
            *piVar1 = 0;
            *piVar2 = 0;
          }
          if (bVar9) {
            *piVar1 = 0;
          }
          piVar19 = piVar2;
          if (!bVar10) break;
        }
        *piVar19 = 0;
        break;
      case YAML_SEQUENCE_START_EVENT:
      case YAML_MAPPING_START_EVENT:
        pyVar21 = (pyVar37->data).scalar.anchor;
        if ((pyVar21 != (yaml_char_t *)0x0) &&
           (iVar15 = yaml_emitter_analyze_anchor(emitter,pyVar21,0), iVar15 == 0)) {
          return 0;
        }
        pyVar21 = (pyVar37->data).scalar.tag;
        if ((pyVar21 != (yaml_char_t *)0x0) &&
           ((emitter->canonical != 0 || ((pyVar37->data).sequence_start.implicit == 0)))) {
          iVar15 = yaml_emitter_analyze_tag(emitter,pyVar21);
          goto LAB_00106031;
        }
      }
      if (YAML_EMIT_END_STATE < emitter->state) {
        return 0;
      }
      pyVar37 = (emitter->events).head;
      switch(emitter->state) {
      case YAML_EMIT_STREAM_START_STATE:
        if (pyVar37->type != YAML_STREAM_START_EVENT) {
          emitter->error = YAML_EMITTER_ERROR;
          pcVar22 = "expected STREAM-START";
          goto LAB_00106ff4;
        }
        yVar16 = emitter->encoding;
        if (yVar16 == YAML_ANY_ENCODING) {
          yVar16 = (pyVar37->data).stream_start.encoding;
          yVar16 = yVar16 + (yVar16 == YAML_ANY_ENCODING);
          emitter->encoding = yVar16;
        }
        iVar15 = emitter->best_indent;
        if (iVar15 - 10U < 0xfffffff8) {
          emitter->best_indent = 2;
          iVar15 = 2;
        }
        if (emitter->best_width < 0) {
          iVar29 = 0x7fffffff;
LAB_00106f0b:
          emitter->best_width = iVar29;
        }
        else {
          iVar29 = 0x50;
          if ((uint)emitter->best_width <= (uint)(iVar15 * 2)) goto LAB_00106f0b;
        }
        if (emitter->line_break == YAML_ANY_BREAK) {
          emitter->line_break = YAML_LN_BREAK;
        }
        emitter->indent = -1;
        emitter->line = 0;
        emitter->column = 0;
        emitter->whitespace = 1;
        emitter->indention = 1;
        if (yVar16 != YAML_UTF8_ENCODING) {
          pyVar21 = (emitter->buffer).pointer;
          if ((emitter->buffer).end <= pyVar21 + 5) {
            iVar15 = yaml_emitter_flush(emitter);
            if (iVar15 == 0) {
              return 0;
            }
            pyVar21 = (emitter->buffer).pointer;
          }
          (emitter->buffer).pointer = pyVar21 + 1;
          *pyVar21 = 0xef;
          pyVar21 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar21 + 1;
          *pyVar21 = 0xbb;
          pyVar21 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar21 + 1;
          *pyVar21 = 0xbf;
        }
        emitter->state = YAML_EMIT_FIRST_DOCUMENT_START_STATE;
        break;
      case YAML_EMIT_FIRST_DOCUMENT_START_STATE:
        iVar15 = 1;
        goto LAB_00106e6a;
      case YAML_EMIT_DOCUMENT_START_STATE:
        iVar15 = 0;
LAB_00106e6a:
        iVar15 = yaml_emitter_emit_document_start(emitter,pyVar37,iVar15);
LAB_00106ebb:
        if (iVar15 == 0) {
          return 0;
        }
        break;
      case YAML_EMIT_DOCUMENT_CONTENT_STATE:
        pyVar20 = *top;
        if (pyVar20 == *end) {
          iVar15 = yaml_stack_extend(&(emitter->states).start,top,end);
          if (iVar15 == 0) {
            emitter->error = YAML_MEMORY_ERROR;
            return 0;
          }
          pyVar20 = *top;
        }
        (emitter->states).top = pyVar20 + 1;
        *pyVar20 = YAML_EMIT_DOCUMENT_END_STATE;
        iVar15 = yaml_emitter_emit_node(emitter,pyVar37,1,0,0,0);
        goto LAB_00106ebb;
      case YAML_EMIT_DOCUMENT_END_STATE:
        if (pyVar37->type != YAML_DOCUMENT_END_EVENT) {
          emitter->error = YAML_EMITTER_ERROR;
          pcVar22 = "expected DOCUMENT-END";
          goto LAB_00106ff4;
        }
        iVar15 = yaml_emitter_write_indent(emitter);
        if (iVar15 == 0) {
          return 0;
        }
        if ((pyVar37->data).stream_start.encoding == YAML_ANY_ENCODING) {
          iVar15 = yaml_emitter_write_indicator(emitter,"...",1,0,0);
          if (iVar15 == 0) {
            return 0;
          }
          iVar15 = yaml_emitter_write_indent(emitter);
          if (iVar15 == 0) {
            return 0;
          }
        }
        iVar15 = yaml_emitter_flush(emitter);
        if (iVar15 == 0) {
          return 0;
        }
        emitter->state = YAML_EMIT_DOCUMENT_START_STATE;
        while (pyVar7 = (emitter->tag_directives).top, (emitter->tag_directives).start != pyVar7) {
          (emitter->tag_directives).top = pyVar7 + -1;
          pyVar21 = pyVar7[-1].prefix;
          yaml_free(pyVar7[-1].handle);
          yaml_free(pyVar21);
        }
        break;
      case YAML_EMIT_FLOW_SEQUENCE_FIRST_ITEM_STATE:
        iVar15 = 1;
        goto LAB_00106e98;
      case YAML_EMIT_FLOW_SEQUENCE_ITEM_STATE:
        iVar15 = 0;
LAB_00106e98:
        iVar15 = yaml_emitter_emit_flow_sequence_item(emitter,pyVar37,iVar15);
        goto LAB_00106ebb;
      case YAML_EMIT_FLOW_MAPPING_FIRST_KEY_STATE:
        iVar15 = 1;
        goto LAB_00106eb6;
      case YAML_EMIT_FLOW_MAPPING_KEY_STATE:
        iVar15 = 0;
LAB_00106eb6:
        iVar15 = yaml_emitter_emit_flow_mapping_key(emitter,pyVar37,iVar15);
        goto LAB_00106ebb;
      case YAML_EMIT_FLOW_MAPPING_SIMPLE_VALUE_STATE:
        iVar15 = 1;
        goto LAB_00106ea7;
      case YAML_EMIT_FLOW_MAPPING_VALUE_STATE:
        iVar15 = 0;
LAB_00106ea7:
        iVar15 = yaml_emitter_emit_flow_mapping_value(emitter,pyVar37,iVar15);
        goto LAB_00106ebb;
      case YAML_EMIT_BLOCK_SEQUENCE_FIRST_ITEM_STATE:
        iVar15 = 1;
        goto LAB_00106dbc;
      case YAML_EMIT_BLOCK_SEQUENCE_ITEM_STATE:
        iVar15 = 0;
LAB_00106dbc:
        iVar15 = yaml_emitter_emit_block_sequence_item(emitter,pyVar37,iVar15);
        goto LAB_00106ebb;
      case YAML_EMIT_BLOCK_MAPPING_FIRST_KEY_STATE:
        iVar15 = 1;
        goto LAB_00106e89;
      case YAML_EMIT_BLOCK_MAPPING_KEY_STATE:
        iVar15 = 0;
LAB_00106e89:
        iVar15 = yaml_emitter_emit_block_mapping_key(emitter,pyVar37,iVar15);
        goto LAB_00106ebb;
      case YAML_EMIT_BLOCK_MAPPING_SIMPLE_VALUE_STATE:
        iVar15 = 1;
        goto LAB_00106dee;
      case YAML_EMIT_BLOCK_MAPPING_VALUE_STATE:
        iVar15 = 0;
LAB_00106dee:
        iVar15 = yaml_emitter_emit_block_mapping_value(emitter,pyVar37,iVar15);
        goto LAB_00106ebb;
      case YAML_EMIT_END_STATE:
        emitter->error = YAML_EMITTER_ERROR;
        pcVar22 = "expected nothing after STREAM-END";
LAB_00106ff4:
        emitter->problem = pcVar22;
        return 0;
      }
      pyVar37 = (emitter->events).head;
      (emitter->events).head = pyVar37 + 1;
      yaml_event_delete(pyVar37);
      pyVar37 = (emitter->events).head;
      pyVar17 = (emitter->events).tail;
    } while (pyVar37 != pyVar17);
  }
  return 1;
LAB_00106900:
  lVar26 = (ulong)((bVar28 & 0xf8) == 0xf0) << 2;
  if ((bVar28 & 0xf0) == 0xe0) {
    lVar26 = 3;
  }
  bVar39 = pbVar18[lVar26];
  bVar43 = true;
  if (((ulong)bVar39 < 0x21) && ((0x100002600U >> ((ulong)bVar39 & 0x3f) & 1) != 0))
  goto LAB_0010648a;
  if (bVar39 == 0xc2) {
    lVar26 = (ulong)((bVar28 & 0xf8) == 0xf0) * 4 + 1;
    if ((bVar28 & 0xf0) == 0xe0) {
      lVar26 = 4;
    }
    if (pbVar18[lVar26] == 0x85) goto LAB_0010648a;
LAB_001069e9:
    lVar26 = 2;
    if ((bVar28 & 0xe0) != 0xc0) {
LAB_00106a05:
      lVar26 = 3;
      if ((bVar28 & 0xf0) != 0xe0) {
        lVar26 = (ulong)((bVar28 & 0xf8) == 0xf0) << 2;
      }
    }
  }
  else {
LAB_001069ac:
    if (bVar39 == 0xe2) {
      if ((char)bVar28 < '\0') {
        if ((bVar28 & 0xe0) != 0xc0) goto LAB_00106a05;
        lVar26 = 2;
      }
      else {
LAB_00106884:
        lVar26 = 1;
      }
    }
    else {
      lVar26 = 1;
      if ((char)bVar28 < '\0') goto LAB_001069e9;
    }
  }
LAB_00106a29:
  if (pbVar18[lVar26] == 0xe2) {
    if (-1 < (char)bVar28) {
      lVar26 = 1;
      goto LAB_00106b2f;
    }
    if ((bVar28 & 0xe0) == 0xc0) {
      lVar26 = 2;
      goto LAB_00106b2f;
    }
  }
  else {
    lVar26 = 1;
    if ((-1 < (char)bVar28) || (lVar26 = 2, (bVar28 & 0xe0) == 0xc0)) goto LAB_00106b2f;
  }
  lVar26 = 3;
  if ((bVar28 & 0xf0) != 0xe0) {
    lVar26 = (ulong)((bVar28 & 0xf8) == 0xf0) << 2;
  }
LAB_00106b2f:
  bVar43 = pbVar18[lVar26] == 0;
  goto LAB_0010648a;
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_emit(yaml_emitter_t *emitter, yaml_event_t *event)
{
    if (!ENQUEUE(emitter, emitter->events, *event)) {
        yaml_event_delete(event);
        return 0;
    }

    while (!yaml_emitter_need_more_events(emitter)) {
        if (!yaml_emitter_analyze_event(emitter, emitter->events.head))
            return 0;
        if (!yaml_emitter_state_machine(emitter, emitter->events.head))
            return 0;
        yaml_event_delete(&DEQUEUE(emitter, emitter->events));
    }

    return 1;
}